

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testclip.cpp
# Opt level: O0

void test_region_fns(void)

{
  undefined8 in_stack_ffffffffffffff78;
  undefined4 uVar1;
  Am_Style *arg6;
  undefined8 in_stack_ffffffffffffff80;
  uint uVar2;
  Am_Style *arg7;
  Am_Style local_68 [8];
  Am_Style local_60 [8];
  Am_Style local_58 [8];
  Am_Style local_50 [8];
  Am_Style local_48 [8];
  Am_Style local_40 [24];
  Am_Style local_28 [8];
  Am_Style local_20 [12];
  int local_14;
  long *plStack_10;
  int counter;
  Am_Region *rgn;
  
  uVar1 = (undefined4)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  uVar2 = (uint)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  printf("Testing low-level Am_Region member functions:\n");
  printf("  Hit RETURN to clip giant black rect to an Am_Region:");
  getchar();
  (**(code **)(*(long *)d1 + 0xe8))();
  clear_whole_window(d1);
  plStack_10 = (long *)Am_Region::Create();
  (**(code **)(*plStack_10 + 0x30))(plStack_10,0x96,0x32,0x50,0x28);
  (**(code **)(*(long *)d1 + 0xf0))(d1,plStack_10);
  (**(code **)(*(long *)d1 + 0x160))
            (d1,&Am_No_Style,&black,0,0,300,CONCAT44(uVar1,200),(ulong)uVar2 << 0x20);
  (**(code **)(*(long *)d1 + 0xa0))();
  (**(code **)(*plStack_10 + 8))();
  printf("  Hit RETURN 6 times to nest Am_Region clipping:  ");
  Am_Style::Am_Style(local_20,(Am_Style *)&red);
  Am_Style::Am_Style(local_28,(Am_Style *)&green);
  Am_Style::Am_Style(local_40,(Am_Style *)&blue);
  Am_Style::Am_Style(local_48,(Am_Style *)&white);
  Am_Style::Am_Style(local_50,(Am_Style *)&black);
  Am_Style::Am_Style(local_58,(Am_Style *)&yellow);
  Am_Style::Am_Style(local_60,(Am_Style *)&Am_No_Style);
  Am_Style::Am_Style(local_68,(Am_Style *)&Am_No_Style);
  arg7 = local_68;
  arg6 = local_60;
  set_style_array(local_20,local_28,local_40,local_48,local_50,local_58,arg6,arg7);
  Am_Style::~Am_Style(local_68);
  Am_Style::~Am_Style(local_60);
  Am_Style::~Am_Style(local_58);
  Am_Style::~Am_Style(local_50);
  Am_Style::~Am_Style(local_48);
  Am_Style::~Am_Style(local_40);
  Am_Style::~Am_Style(local_28);
  Am_Style::~Am_Style(local_20);
  clear_whole_window(d1);
  plStack_10 = (long *)Am_Region::Create();
  for (local_14 = 0; uVar1 = (undefined4)((ulong)arg6 >> 0x20), local_14 < 6;
      local_14 = local_14 + 1) {
    getchar();
    printf("%d  ",(ulong)(local_14 + 1));
    (**(code **)(*plStack_10 + 0x40))(plStack_10,local_14 * 10 + 10,local_14 * 10 + 10,0x96);
    (**(code **)(*(long *)d1 + 0xf0))(d1,plStack_10);
    arg6 = (Am_Style *)CONCAT44(uVar1,200);
    arg7 = (Am_Style *)((ulong)arg7 & 0xffffffff00000000);
    (**(code **)(*(long *)d1 + 0x160))
              (d1,&Am_No_Style,style_array + (long)local_14 * 8,0,0,300,arg6,arg7);
    (**(code **)(*(long *)d1 + 0xa0))();
  }
  printf("\n");
  printf("  Hit RETURN 6 times to pop Am_Region clipping:  ");
  for (local_14 = 0; uVar1 = (undefined4)((ulong)arg6 >> 0x20), local_14 < 6;
      local_14 = local_14 + 1) {
    getchar();
    printf("%d  ",(ulong)(local_14 + 1));
    (**(code **)(*plStack_10 + 0x48))();
    (**(code **)(*(long *)d1 + 0xf0))(d1,plStack_10);
    arg6 = (Am_Style *)CONCAT44(uVar1,200);
    arg7 = (Am_Style *)((ulong)arg7 & 0xffffffff00000000);
    (**(code **)(*(long *)d1 + 0x160))(d1,&Am_No_Style,&purple,0,0,300,arg6,arg7);
    (**(code **)(*(long *)d1 + 0xa0))();
  }
  printf("\n");
  printf("  Hit RETURN 2 times to push again onto that same Am_Region:  ");
  for (local_14 = 0; uVar1 = (undefined4)((ulong)arg6 >> 0x20), local_14 < 2;
      local_14 = local_14 + 1) {
    getchar();
    printf("%d  ",(ulong)(local_14 + 1));
    (**(code **)(*plStack_10 + 0x40))(plStack_10,local_14 * 10 + 0x32,local_14 * 10 + 0x32,200,0x32)
    ;
    (**(code **)(*(long *)d1 + 0xf0))(d1,plStack_10);
    arg6 = (Am_Style *)CONCAT44(uVar1,200);
    arg7 = (Am_Style *)((ulong)arg7 & 0xffffffff00000000);
    (**(code **)(*(long *)d1 + 0x160))
              (d1,&Am_No_Style,style_array + (long)local_14 * 8,0,0,300,arg6,arg7);
    (**(code **)(*(long *)d1 + 0xa0))();
  }
  printf("\n");
  return;
}

Assistant:

void
test_region_fns()
{
  printf("Testing low-level Am_Region member functions:\n");

  printf("  Hit RETURN to clip giant black rect to an Am_Region:");
  getchar();

  d1->Clear_Clip();
  clear_whole_window(d1);
  ;

  Am_Region *rgn = Am_Region::Create();
  rgn->Set(150, 50, 80, 40);
  d1->Set_Clip(rgn);
  d1->Draw_Rectangle(Am_No_Style, black, 0, 0, 300, 200);
  d1->Flush_Output();
  rgn->Destroy();

  int counter;
  printf("  Hit RETURN 6 times to nest Am_Region clipping:  ");
  set_style_array(red, green, blue, white, black, yellow);
  clear_whole_window(d1);
  ;

  rgn = Am_Region::Create();
  for (counter = 0; counter <= 5; counter++) {
    getchar();
    printf("%d  ", counter + 1);
    rgn->Push(10 + 10 * counter, 10 + 10 * counter, 150, 150);
    d1->Set_Clip(rgn);
    d1->Draw_Rectangle(Am_No_Style, style_array[counter], 0, 0, 300, 200);
    d1->Flush_Output();
  }
  printf("\n");

  printf("  Hit RETURN 6 times to pop Am_Region clipping:  ");
  for (counter = 0; counter <= 5; counter++) {
    getchar();
    printf("%d  ", counter + 1);
    rgn->Pop();
    d1->Set_Clip(rgn);
    d1->Draw_Rectangle(Am_No_Style, purple, 0, 0, 300, 200);
    d1->Flush_Output();
  }
  printf("\n");

  printf("  Hit RETURN 2 times to push again onto that same Am_Region:  ");
  for (counter = 0; counter <= 1; counter++) {
    getchar();
    printf("%d  ", counter + 1);
    rgn->Push(50 + 10 * counter, 50 + 10 * counter, 200, 50);
    d1->Set_Clip(rgn);
    d1->Draw_Rectangle(Am_No_Style, style_array[counter], 0, 0, 300, 200);
    d1->Flush_Output();
  }
  printf("\n");
}